

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall test_matrix_sparse_at_Test::TestBody(test_matrix_sparse_at_Test *this)

{
  initializer_list<double> value;
  initializer_list<double> value_00;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> index_00;
  initializer_list<unsigned_long> non_zero_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  double *pdVar4;
  char *pcVar5;
  char *regex;
  char *regex_00;
  char *regex_01;
  char *regex_02;
  char *regex_03;
  char *regex_04;
  AssertHelper local_618;
  Message local_610 [6];
  exception *gtest_exception_5;
  size_t local_5d8;
  double local_5d0;
  double x_5;
  ReturnSentinel gtest_sentinel_5;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_5;
  pointer local_5a0;
  DeathTest *gtest_dt_5;
  Message local_590 [6];
  exception *gtest_exception_4;
  size_t local_558;
  double local_550;
  double x_4;
  ReturnSentinel gtest_sentinel_4;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_4;
  pointer local_520;
  DeathTest *gtest_dt_4;
  Message local_510 [6];
  exception *gtest_exception_3;
  size_t local_4d8;
  double local_4d0;
  double x_3;
  ReturnSentinel gtest_sentinel_3;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_3;
  pointer local_4a0;
  DeathTest *gtest_dt_3;
  Message local_490;
  size_t local_488 [2];
  undefined1 local_478 [8];
  AssertionResult gtest_ar_2;
  unsigned_long local_418 [8];
  iterator local_3d8;
  undefined8 local_3d0;
  unsigned_long local_3c8 [5];
  iterator local_3a0;
  undefined8 local_398;
  undefined1 local_390 [8];
  Matrix_Sparse matrix_const;
  Message local_338 [6];
  exception *gtest_exception_2;
  size_t local_300;
  double local_2f8;
  double x_2;
  ReturnSentinel gtest_sentinel_2;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_2;
  pointer local_2c8;
  DeathTest *gtest_dt_2;
  Message local_2b8 [6];
  exception *gtest_exception_1;
  size_t local_280;
  double local_278;
  double x_1;
  ReturnSentinel gtest_sentinel_1;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_1;
  pointer local_248;
  DeathTest *gtest_dt_1;
  Message local_238;
  int local_22c;
  exception *gtest_exception;
  size_t local_1f8;
  double local_1f0;
  double x;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_1c0;
  DeathTest *gtest_dt;
  Message local_1b0;
  size_t local_1a8 [2];
  undefined1 local_198 [8];
  AssertionResult gtest_ar_1;
  size_t local_180;
  AssertHelper local_178;
  Message local_170 [3];
  size_t local_158 [2];
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  unsigned_long local_e8 [8];
  iterator local_a8;
  undefined8 local_a0;
  unsigned_long local_98 [5];
  iterator local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  Matrix_Sparse matrix_non_const;
  test_matrix_sparse_at_Test *this_local;
  
  local_98[2] = 5;
  local_98[3] = 5;
  local_98[0] = 0;
  local_98[1] = 2;
  local_98[4] = 7;
  local_70 = local_98;
  local_68 = 5;
  local_e8[4] = 3;
  local_e8[5] = 4;
  local_e8[2] = 2;
  local_e8[3] = 0;
  local_e8[0] = 1;
  local_e8[1] = 3;
  local_e8[6] = 3;
  local_a8 = local_e8;
  local_a0 = 7;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3ff0000000000000;
  non_zero_00._M_len = 5;
  non_zero_00._M_array = local_70;
  index_00._M_len = 7;
  index_00._M_array = local_a8;
  value._M_len = 7;
  value._M_array = (iterator)&gtest_ar.message_;
  matrix_non_const.column_size = (size_t)this;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_60,non_zero_00,index_00,value,5);
  local_158[1] = 3;
  local_158[0] = 4;
  pdVar4 = Disa::Matrix_Sparse::at((Matrix_Sparse *)local_60,local_158 + 1,local_158);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_148,"matrix_non_const.at(3, 4)","6.0",*pdVar4,6.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(local_170);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x51,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message(local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_180 = 3;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4;
  pdVar4 = Disa::Matrix_Sparse::at
                     ((Matrix_Sparse *)local_60,&local_180,(size_t *)&gtest_ar_1.message_);
  *pdVar4 = -10.0;
  local_1a8[1] = 3;
  local_1a8[0] = 4;
  pdVar4 = Disa::Matrix_Sparse::at((Matrix_Sparse *)local_60,local_1a8 + 1,local_1a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_198,"matrix_non_const.at(3, 4)","-10.0",*pdVar4,-10.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x53,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"./*",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("double x = matrix_non_const.at(10, 4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x54,&local_1c0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_001164bd;
    if (local_1c0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_1c0);
      iVar2 = (*local_1c0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_1c0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_1c0->_vptr_DeathTest[4])(local_1c0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0011647f;
        local_22c = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&x,local_1c0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_1f8 = 10;
            gtest_exception = (exception *)0x4;
            pdVar4 = Disa::Matrix_Sparse::at
                               ((Matrix_Sparse *)local_60,&local_1f8,(size_t *)&gtest_exception);
            local_1f0 = *pdVar4;
          }
          (*local_1c0->_vptr_DeathTest[5])(local_1c0,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel((ReturnSentinel *)&x);
        }
LAB_0011647f:
        local_22c = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_22c != 0) goto LAB_001164bd;
    }
  }
  else {
LAB_001164bd:
    testing::Message::Message(&local_238);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x54,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_1,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_1);
    testing::Message::~Message(&local_238);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1,(internal *)"./*",regex_00);
    bVar1 = testing::internal::DeathTest::Create
                      ("double x = matrix_non_const.at(0, 6)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x55,&local_248);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00116964;
    if (local_248 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_1,local_248);
      iVar2 = (*local_248->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_248->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_248->_vptr_DeathTest[4])(local_248,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00116926;
        local_22c = 4;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&x_1,local_248);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_280 = 0;
            gtest_exception_1 = (exception *)0x6;
            pdVar4 = Disa::Matrix_Sparse::at
                               ((Matrix_Sparse *)local_60,&local_280,(size_t *)&gtest_exception_1);
            local_278 = *pdVar4;
          }
          (*local_248->_vptr_DeathTest[5])(local_248,2);
          local_22c = 5;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel((ReturnSentinel *)&x_1);
        }
LAB_00116926:
        local_22c = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_1);
      if (local_22c != 0) goto LAB_00116964;
    }
  }
  else {
LAB_00116964:
    testing::Message::Message(local_2b8);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x55,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_2,local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_2);
    testing::Message::~Message(local_2b8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2,(internal *)"./*",regex_01);
    bVar1 = testing::internal::DeathTest::Create
                      ("double x = matrix_non_const.at(10, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x56,&local_2c8);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00116e0b;
    if (local_2c8 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_2,local_2c8);
      iVar2 = (*local_2c8->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_2c8->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_2c8->_vptr_DeathTest[4])(local_2c8,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00116dcd;
        local_22c = 6;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&x_2,local_2c8);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_300 = 10;
            gtest_exception_2 = (exception *)0x2;
            pdVar4 = Disa::Matrix_Sparse::at
                               ((Matrix_Sparse *)local_60,&local_300,(size_t *)&gtest_exception_2);
            local_2f8 = *pdVar4;
          }
          (*local_2c8->_vptr_DeathTest[5])(local_2c8,2);
          local_22c = 7;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel((ReturnSentinel *)&x_2);
        }
LAB_00116dcd:
        local_22c = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_2);
      if (local_22c != 0) goto LAB_00116e0b;
    }
  }
  else {
LAB_00116e0b:
    testing::Message::Message(local_338);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&matrix_const.column_size,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x56,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&matrix_const.column_size,local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&matrix_const.column_size);
    testing::Message::~Message(local_338);
  }
  local_3c8[2] = 5;
  local_3c8[3] = 5;
  local_3c8[0] = 0;
  local_3c8[1] = 2;
  local_3c8[4] = 7;
  local_3a0 = local_3c8;
  local_398 = 5;
  local_418[4] = 3;
  local_418[5] = 4;
  local_418[2] = 2;
  local_418[3] = 0;
  local_418[0] = 1;
  local_418[1] = 3;
  local_418[6] = 3;
  local_3d8 = local_418;
  local_3d0 = 7;
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3ff0000000000000;
  non_zero._M_len = 5;
  non_zero._M_array = local_3a0;
  index._M_len = 7;
  index._M_array = local_3d8;
  value_00._M_len = 7;
  value_00._M_array = (iterator)&gtest_ar_2.message_;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_390,non_zero,index,value_00,5);
  local_488[1] = 3;
  local_488[0] = 4;
  pdVar4 = Disa::Matrix_Sparse::at((Matrix_Sparse *)local_390,local_488 + 1,local_488);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_478,"matrix_const.at(3, 4)","6.0",*pdVar4,6.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x59,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_3,&local_490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_3);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3,(internal *)"./*",regex_02);
    bVar1 = testing::internal::DeathTest::Create
                      ("double x = matrix_const.at(10, 4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x5a,&local_4a0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00117567;
    if (local_4a0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_3,local_4a0);
      iVar2 = (*local_4a0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_4a0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_4a0->_vptr_DeathTest[4])(local_4a0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00117529;
        local_22c = 8;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&x_3,local_4a0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_4d8 = 10;
            gtest_exception_3 = (exception *)0x4;
            pdVar4 = Disa::Matrix_Sparse::at
                               ((Matrix_Sparse *)local_390,&local_4d8,(size_t *)&gtest_exception_3);
            local_4d0 = *pdVar4;
          }
          (*local_4a0->_vptr_DeathTest[5])(local_4a0,2);
          local_22c = 9;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel((ReturnSentinel *)&x_3);
        }
LAB_00117529:
        local_22c = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_3);
      if (local_22c != 0) goto LAB_00117567;
    }
  }
  else {
LAB_00117567:
    testing::Message::Message(local_510);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x5a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_4,local_510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_4);
    testing::Message::~Message(local_510);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_4,(internal *)"./*",regex_03);
    bVar1 = testing::internal::DeathTest::Create
                      ("double x = matrix_const.at(0, 6)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x5b,&local_520);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_4);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00117a11;
    if (local_520 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_4,local_520);
      iVar2 = (*local_520->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_520->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_520->_vptr_DeathTest[4])(local_520,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_001179d3;
        local_22c = 10;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&x_4,local_520);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_558 = 0;
            gtest_exception_4 = (exception *)0x6;
            pdVar4 = Disa::Matrix_Sparse::at
                               ((Matrix_Sparse *)local_390,&local_558,(size_t *)&gtest_exception_4);
            local_550 = *pdVar4;
          }
          (*local_520->_vptr_DeathTest[5])(local_520,2);
          local_22c = 0xb;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel((ReturnSentinel *)&x_4);
        }
LAB_001179d3:
        local_22c = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_4);
      if (local_22c != 0) goto LAB_00117a11;
    }
  }
  else {
LAB_00117a11:
    testing::Message::Message(local_590);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x5b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_5,local_590);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_5);
    testing::Message::~Message(local_590);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_5,(internal *)"./*",regex_04);
    bVar1 = testing::internal::DeathTest::Create
                      ("double x = matrix_const.at(10, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x5c,&local_5a0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_5);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_5a0 == (pointer)0x0) goto LAB_00117f6c;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_5,local_5a0);
      iVar2 = (*local_5a0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_5a0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_5a0->_vptr_DeathTest[4])(local_5a0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00117e7d;
        local_22c = 0xc;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&x_5,local_5a0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_5d8 = 10;
            gtest_exception_5 = (exception *)0x2;
            pdVar4 = Disa::Matrix_Sparse::at
                               ((Matrix_Sparse *)local_390,&local_5d8,(size_t *)&gtest_exception_5);
            local_5d0 = *pdVar4;
          }
          (*local_5a0->_vptr_DeathTest[5])(local_5a0,2);
          local_22c = 0xd;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel((ReturnSentinel *)&x_5);
        }
LAB_00117e7d:
        local_22c = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_5);
      if (local_22c == 0) goto LAB_00117f6c;
    }
  }
  testing::Message::Message(local_610);
  pcVar5 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_618,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
             ,0x5c,pcVar5);
  testing::internal::AssertHelper::operator=(&local_618,local_610);
  testing::internal::AssertHelper::~AssertHelper(&local_618);
  testing::Message::~Message(local_610);
LAB_00117f6c:
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_390);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_60);
  return;
}

Assistant:

TEST(test_matrix_sparse, at) {
  Matrix_Sparse matrix_non_const({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  EXPECT_DOUBLE_EQ(matrix_non_const.at(3, 4), 6.0);
  matrix_non_const.at(3, 4) = -10.0;
  EXPECT_DOUBLE_EQ(matrix_non_const.at(3, 4), -10.0);
  EXPECT_DEATH(double x = matrix_non_const.at(10, 4), "./*");
  EXPECT_DEATH(double x = matrix_non_const.at(0, 6), "./*");
  EXPECT_DEATH(double x = matrix_non_const.at(10, 2), "./*");

  const Matrix_Sparse matrix_const({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  EXPECT_DOUBLE_EQ(matrix_const.at(3, 4), 6.0);
  EXPECT_DEATH(double x = matrix_const.at(10, 4), "./*");
  EXPECT_DEATH(double x = matrix_const.at(0, 6), "./*");
  EXPECT_DEATH(double x = matrix_const.at(10, 2), "./*");
}